

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O3

void __thiscall
de::FilePath::split(FilePath *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *components)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  char cVar4;
  bool bVar5;
  size_type sVar6;
  int iVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(components,
                    (components->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  uVar2 = (this->m_path)._M_string_length;
  if (uVar2 < 2) {
    if (uVar2 == 0) goto LAB_0016c838;
    cVar4 = *(this->m_path)._M_dataplus._M_p;
  }
  else {
    pcVar3 = (this->m_path)._M_dataplus._M_p;
    cVar4 = *pcVar3;
    if (((cVar4 == '\\') || (cVar4 == '/')) &&
       ((cVar1 = pcVar3[1], cVar1 == '\\' || (cVar1 == '/')))) {
      std::operator+(&local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &separator_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &separator_abi_cxx11_);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)components,
                 &local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0016c838;
    }
  }
  if (((cVar4 == '\\') || (cVar4 == '/')) && (bVar5 = beginsWithDrive(this), !bVar5)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(components,(value_type *)&separator_abi_cxx11_);
  }
LAB_0016c838:
  sVar6 = (this->m_path)._M_string_length;
  lVar8 = 0;
  if ((int)sVar6 < 1) {
    iVar7 = 0;
  }
  else {
    iVar7 = 0;
    do {
      cVar4 = (this->m_path)._M_dataplus._M_p[lVar8];
      if ((cVar4 == '/') || (cVar4 == '\\')) {
        if (0 < (int)lVar8 - iVar7) {
          std::__cxx11::string::substr((ulong)&local_48,(ulong)this);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)components
                     ,&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
          sVar6 = (this->m_path)._M_string_length;
        }
        iVar7 = (int)lVar8 + 1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (int)sVar6);
  }
  if (0 < (int)lVar8 - iVar7) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)this);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)components,
               &local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void FilePath::split (std::vector<std::string>& components) const
{
	components.clear();

	int curCompStart = 0;
	int pos;

	if (isWinNetPath())
		components.push_back(separator + separator);
	else if (isRootPath() && !beginsWithDrive())
		components.push_back(separator);

	for (pos = 0; pos < (int)m_path.length(); pos++)
	{
		const char c = m_path[pos];

		if (isSeparator(c))
		{
			if (pos - curCompStart > 0)
				components.push_back(m_path.substr(curCompStart, pos - curCompStart));

			curCompStart = pos+1;
		}
	}

	if (pos - curCompStart > 0)
		components.push_back(m_path.substr(curCompStart, pos - curCompStart));
}